

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O0

int __thiscall CCtrlSystem::isExist(CCtrlSystem *this,int *id)

{
  size_t i;
  int index;
  int *id_local;
  CCtrlSystem *this_local;
  
  i = 0;
  while( true ) {
    if ((ulong)(long)this->_size <= i) {
      return -1;
    }
    if (*id == this->_p_workerArray[i]->_id) break;
    i = i + 1;
  }
  return (int)i;
}

Assistant:

int CCtrlSystem::isExist(const int& id) const
{
	int index = -1; // ***************important*****************
	for (size_t i = 0; i < this->_size; i++)
	{
		if (id == this->_p_workerArray[i]->_id)
		{
			index = i;
			break;
		}
	}
	return index;
}